

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O0

AggregateFunctionSet * duckdb::StringAggFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  AggregateFunctionSet *in_RDI;
  AggregateFunction string_agg_param;
  AggregateFunctionSet *string_agg;
  allocator_type *in_stack_fffffffffffffb28;
  code *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffb30;
  code *this;
  iterator in_stack_fffffffffffffb38;
  code *__args;
  size_type in_stack_fffffffffffffb40;
  code *this_00;
  LogicalType *local_450;
  aggregate_update_t in_stack_fffffffffffffbd8;
  aggregate_initialize_t in_stack_fffffffffffffbe0;
  aggregate_size_t in_stack_fffffffffffffbe8;
  LogicalType *in_stack_fffffffffffffbf0;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffbf8;
  AggregateFunction *in_stack_fffffffffffffc00;
  aggregate_combine_t in_stack_fffffffffffffc40;
  aggregate_finalize_t in_stack_fffffffffffffc48;
  aggregate_simple_update_t in_stack_fffffffffffffc50;
  bind_aggregate_function_t in_stack_fffffffffffffc58;
  aggregate_destructor_t in_stack_fffffffffffffc60;
  aggregate_statistics_t in_stack_fffffffffffffc68;
  aggregate_window_t in_stack_fffffffffffffc70;
  aggregate_serialize_t in_stack_fffffffffffffc78;
  aggregate_deserialize_t in_stack_fffffffffffffc80;
  LogicalType local_1c8 [27];
  undefined1 local_1ad;
  LogicalType local_1a0 [24];
  LogicalType *local_188;
  LogicalType local_180 [24];
  LogicalType *local_168;
  undefined8 local_160;
  code *local_38;
  code *local_30;
  byte local_9;
  
  local_9 = 0;
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  local_1ad = 1;
  local_188 = local_180;
  duckdb::LogicalType::LogicalType(local_1a0,VARCHAR);
  duckdb::LogicalType::ANY_PARAMS(local_180,local_1a0,5);
  local_1ad = 0;
  local_168 = local_180;
  local_160 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x827560);
  iVar1._M_len = in_stack_fffffffffffffb40;
  iVar1._M_array = in_stack_fffffffffffffb38;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffb30,iVar1,in_stack_fffffffffffffb28);
  duckdb::LogicalType::LogicalType(local_1c8,VARCHAR);
  this_00 = StringAggBind;
  __args = AggregateFunction::
           UnaryUpdate<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>;
  this = AggregateFunction::
         StateFinalize<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>;
  function = AggregateFunction::StateCombine<duckdb::StringAggState,duckdb::StringAggFunction>;
  AggregateFunction::AggregateFunction
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc48,in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc58,in_stack_fffffffffffffc60,in_stack_fffffffffffffc68,
             in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,in_stack_fffffffffffffc80);
  duckdb::LogicalType::~LogicalType(local_1c8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x827647);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x827654);
  local_450 = (LogicalType *)&local_168;
  do {
    local_450 = local_450 + -0x18;
    duckdb::LogicalType::~LogicalType(local_450);
  } while (local_450 != local_180);
  duckdb::LogicalType::~LogicalType(local_1a0);
  local_38 = StringAggSerialize;
  local_30 = StringAggDeserialize;
  AggregateFunction::AggregateFunction((AggregateFunction *)this_00,(AggregateFunction *)__args);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,(AggregateFunction *)function);
  AggregateFunction::~AggregateFunction((AggregateFunction *)this);
  std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,
             (LogicalTypeId *)__args);
  AggregateFunction::AggregateFunction((AggregateFunction *)this_00,(AggregateFunction *)__args);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,(AggregateFunction *)function);
  AggregateFunction::~AggregateFunction((AggregateFunction *)this);
  local_9 = 1;
  AggregateFunction::~AggregateFunction((AggregateFunction *)this);
  if ((local_9 & 1) == 0) {
    AggregateFunctionSet::~AggregateFunctionSet((AggregateFunctionSet *)0x827931);
  }
  return in_RDI;
}

Assistant:

AggregateFunctionSet StringAggFun::GetFunctions() {
	AggregateFunctionSet string_agg;
	AggregateFunction string_agg_param(
	    {LogicalType::ANY_PARAMS(LogicalType::VARCHAR)}, LogicalType::VARCHAR,
	    AggregateFunction::StateSize<StringAggState>,
	    AggregateFunction::StateInitialize<StringAggState, StringAggFunction>,
	    AggregateFunction::UnaryScatterUpdate<StringAggState, string_t, StringAggFunction>,
	    AggregateFunction::StateCombine<StringAggState, StringAggFunction>,
	    AggregateFunction::StateFinalize<StringAggState, string_t, StringAggFunction>,
	    AggregateFunction::UnaryUpdate<StringAggState, string_t, StringAggFunction>, StringAggBind);
	string_agg_param.serialize = StringAggSerialize;
	string_agg_param.deserialize = StringAggDeserialize;
	string_agg.AddFunction(string_agg_param);
	string_agg_param.arguments.emplace_back(LogicalType::VARCHAR);
	string_agg.AddFunction(string_agg_param);
	return string_agg;
}